

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

void __thiscall sqlite::Connection::Stmt::bind_null(Stmt *this,int index)

{
  int iVar1;
  undefined8 uVar2;
  sqlite3 *db;
  char *pcVar3;
  undefined4 in_ESI;
  string *in_RDI;
  int status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 uVar5;
  allocator in_stack_ffffffffffffff3f;
  Logic_error *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff5c;
  
  iVar1 = sqlite3_bind_null(*(undefined8 *)in_RDI,in_ESI);
  if (iVar1 != 0) {
    uVar5 = 1;
    uVar2 = __cxa_allocate_exception(0x48);
    std::__cxx11::to_string(in_stack_ffffffffffffff5c);
    std::operator+((char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    db = (sqlite3 *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 8));
    std::operator+(in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10);
    pcVar3 = (char *)sqlite3_sql(*(undefined8 *)in_RDI);
    paVar4 = (allocator *)&stack0xffffffffffffff3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff40,pcVar3,paVar4);
    Logic_error::Logic_error
              (in_stack_ffffffffffffff40,
               (string *)
               CONCAT17(in_stack_ffffffffffffff3f,CONCAT16(uVar5,in_stack_ffffffffffffff38)),in_RDI,
               (int)((ulong)uVar2 >> 0x20),db);
    __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
  }
  return;
}

Assistant:

void Connection::Stmt::bind_null(const int index)
    {
        int status = sqlite3_bind_null(stmt_, index);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding index " +
                std::to_string(index) + ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }